

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void testing::internal::ParseGoogleTestFlagsOnlyImpl<wchar_t>(int *argc,wchar_t **argv)

{
  bool bVar1;
  bool bVar2;
  char *arg_00;
  wchar_t **in_RDX;
  wchar_t **extraout_RDX;
  int local_60;
  int j;
  bool remove_flag;
  char *arg;
  string arg_string;
  int i;
  wchar_t **argv_local;
  int *argc_local;
  
  for (arg_string.field_2._12_4_ = 1; (int)arg_string.field_2._12_4_ < *argc;
      arg_string.field_2._12_4_ = arg_string.field_2._12_4_ + 1) {
    StreamableToString<wchar_t*>
              ((string *)&arg,(internal *)(argv + (int)arg_string.field_2._12_4_),in_RDX);
    arg_00 = (char *)std::__cxx11::string::c_str();
    bVar1 = false;
    bVar2 = ParseGoogleTestFlag(arg_00);
    if (bVar2) {
      bVar1 = true;
    }
    else {
      bVar2 = ParseStringFlag<std::__cxx11::string>
                        (arg_00,"flagfile",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         FLAGS_gtest_flagfile_abi_cxx11_);
      if (bVar2) {
        LoadFlagsFromFile((string *)FLAGS_gtest_flagfile_abi_cxx11_);
        bVar1 = true;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&arg,"--help");
        if ((((bVar2) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&arg,"-h"), bVar2)) ||
            (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&arg,"-?"), bVar2)) ||
           ((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&arg,"/?"), bVar2 ||
            (bVar2 = HasGoogleTestFlagPrefix(arg_00), bVar2)))) {
          g_help_flag = 1;
        }
      }
    }
    if (bVar1) {
      for (local_60 = arg_string.field_2._12_4_; local_60 != *argc; local_60 = local_60 + 1) {
        argv[local_60] = argv[local_60 + 1];
      }
      *argc = *argc + -1;
      arg_string.field_2._12_4_ = arg_string.field_2._12_4_ + -1;
    }
    std::__cxx11::string::~string((string *)&arg);
    in_RDX = extraout_RDX;
  }
  if ((g_help_flag & 1) != 0) {
    PrintColorEncoded(
                     "This program contains tests written using Google Test. You can use the\nfollowing command line flags to control its behavior:\n\nTest Selection:\n  @G--gtest_list_tests@D\n      List the names of all tests instead of running them. The name of\n      TEST(Foo, Bar) is \"Foo.Bar\".\n  @G--gtest_filter=@YPOSTIVE_PATTERNS[@G-@YNEGATIVE_PATTERNS]@D\n      Run only the tests whose name matches one of the positive patterns but\n      none of the negative patterns. \'?\' matches any single character; \'*\'\n      matches any substring; \':\' separates two patterns.\n  @G--gtest_also_run_disabled_tests@D\n      Run all disabled tests too.\n\nTest Execution:\n  @G--gtest_repeat=@Y[COUNT]@D\n      Run the tests repeatedly; use a negative count to repeat forever.\n  @G--gtest_shuffle@D\n      Randomize tests\' orders on every iteration.\n  @G--gtest_random_seed=@Y[NUMBER]@D\n      Random number seed to use for shuffling test orders (between 1 and\n      99999, or 0 to use a seed based on the current time).\n\nTest Output:\n  @G--gtest_color=@Y(@Gyes@Y|@Gno@Y|@Gauto@Y)@D\n      Enable/disable colored output. The default is @Gauto@D.\n  -@G-gtest_print_time=0@D\n      Don\'t print the elapsed time of each test.\n  @G--gtest_output=@Y(@Gjson@Y|@Gxml@Y)[@G:@YDIRECTORY_PATH@G/@Y|@G:@YFILE_PATH]@D\n      Generate a JSON or XML report in the given directory or with the given\n      file name. @YFILE_PATH@D defaults to @Gtest_details.xml@D.\n  @G--gtest_stream_result_to=@YHOST@G:@YPORT@D\n      Stream test results to the given server.\n\nAssertion Behavior:\n  @G--gtest_death_test_style=@Y(@Gfast@Y|@Gthreadsafe@Y)@D\n      Set the default death test style.\n  @G--gtest_break_on_failure@D\n      Turn assertion failures into debugger break-points.\n  @G--gtest_throw_on_failure@D\n      Turn assertion failures into C++ exceptions for use by an external\n      test framework.\n  @G--gtest_catch_exceptions=0@D\n      Do not report exceptions as test failures. Instead, allow them\n      to crash the program or throw a pop-up (on Windows).\n\nExcept for @G--gtest_list_tests@D, you can alternati..." /* TRUNCATED STRING LITERAL */
                     );
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    bool remove_flag = false;
    if (ParseGoogleTestFlag(arg)) {
      remove_flag = true;
#if GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (ParseStringFlag(arg, kFlagfileFlag, &GTEST_FLAG(flagfile))) {
      LoadFlagsFromFile(GTEST_FLAG(flagfile));
      remove_flag = true;
#endif  // GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }

    if (remove_flag) {
      // Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}